

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::java::HasRequiredFields
               (Descriptor *type,
               hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
               *already_seen)

{
  int *piVar1;
  bool bVar2;
  JavaType JVar3;
  size_type sVar4;
  Descriptor *type_00;
  __hashtable *__h;
  bool bVar5;
  long lVar6;
  FieldDescriptor *field;
  long lVar7;
  __node_gen_type __node_gen;
  Descriptor *local_38;
  hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
  *local_30;
  
  local_38 = type;
  sVar4 = std::
          _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)already_seen,&local_38);
  if (sVar4 == 0) {
    local_30 = already_seen;
    std::
    _Hashtable<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::Descriptor_const*>,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<google::protobuf::Descriptor_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<google::protobuf::Descriptor_const*,true>>>>
              ((_Hashtable<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::Descriptor_const*>,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)already_seen,&local_38);
    bVar5 = true;
    if (((*(int *)(local_38 + 0x68) < 1) &&
        (bVar5 = 0 < *(int *)(local_38 + 0x2c), 0 < *(int *)(local_38 + 0x2c))) &&
       (field = *(FieldDescriptor **)(local_38 + 0x30), *(int *)(field + 0x4c) != 2)) {
      lVar6 = 0xf4;
      lVar7 = 0;
      do {
        JVar3 = GetJavaType(field);
        if (JVar3 == JAVATYPE_MESSAGE) {
          type_00 = FieldDescriptor::message_type(field);
          bVar2 = HasRequiredFields(type_00,already_seen);
          if (bVar2) {
            return bVar5;
          }
        }
        lVar7 = lVar7 + 1;
        bVar5 = lVar7 < *(int *)(local_38 + 0x2c);
        if (*(int *)(local_38 + 0x2c) <= lVar7) {
          return bVar5;
        }
        field = (FieldDescriptor *)(lVar7 * 0xa8 + *(long *)(local_38 + 0x30));
        piVar1 = (int *)(*(long *)(local_38 + 0x30) + lVar6);
        lVar6 = lVar6 + 0xa8;
      } while (*piVar1 != 2);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool HasRequiredFields(
    const Descriptor* type,
    hash_set<const Descriptor*>* already_seen) {
  if (already_seen->count(type) > 0) {
    // The type is already in cache.  This means that either:
    // a. The type has no required fields.
    // b. We are in the midst of checking if the type has required fields,
    //    somewhere up the stack.  In this case, we know that if the type
    //    has any required fields, they'll be found when we return to it,
    //    and the whole call to HasRequiredFields() will return true.
    //    Therefore, we don't have to check if this type has required fields
    //    here.
    return false;
  }
  already_seen->insert(type);

  // If the type has extensions, an extension with message type could contain
  // required fields, so we have to be conservative and assume such an
  // extension exists.
  if (type->extension_range_count() > 0) return true;

  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);
    if (field->is_required()) {
      return true;
    }
    if (GetJavaType(field) == JAVATYPE_MESSAGE) {
      if (HasRequiredFields(field->message_type(), already_seen)) {
        return true;
      }
    }
  }

  return false;
}